

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_getmetatable(lua_State *L,int objindex)

{
  StkId pTVar1;
  uint uVar2;
  TValue *pTVar3;
  Table *x_;
  TValue *io;
  Table *pTStack_28;
  int res;
  Table *mt;
  TValue *obj;
  int objindex_local;
  lua_State *L_local;
  
  pTVar3 = index2addr(L,objindex);
  uVar2 = pTVar3->tt_ & 0xf;
  if (uVar2 == 5) {
    pTStack_28 = *(Table **)((pTVar3->value_).f + 0x28);
  }
  else if (uVar2 == 7) {
    pTStack_28 = *(Table **)((pTVar3->value_).f + 0x10);
  }
  else {
    pTStack_28 = L->l_G->mt[(int)(pTVar3->tt_ & 0xf)];
  }
  if (pTStack_28 != (Table *)0x0) {
    pTVar1 = L->top;
    (pTVar1->value_).gc = (GCObject *)pTStack_28;
    pTVar1->tt_ = 0x45;
    L->top = L->top + 1;
  }
  io._4_4_ = (uint)(pTStack_28 != (Table *)0x0);
  return io._4_4_;
}

Assistant:

LUA_API int lua_getmetatable (lua_State *L, int objindex) {
  const TValue *obj;
  Table *mt;
  int res = 0;
  lua_lock(L);
  obj = index2addr(L, objindex);
  switch (ttnov(obj)) {
    case LUA_TTABLE:
      mt = hvalue(obj)->metatable;
      break;
    case LUA_TUSERDATA:
      mt = uvalue(obj)->metatable;
      break;
    default:
      mt = G(L)->mt[ttnov(obj)];
      break;
  }
  if (mt != NULL) {
    sethvalue(L, L->top, mt);
    api_incr_top(L);
    res = 1;
  }
  lua_unlock(L);
  return res;
}